

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int aec_buffer_decode(aec_stream_conflict *strm)

{
  int iVar1;
  int in_ESI;
  
  iVar1 = aec_decode_init(strm);
  if (iVar1 == 0) {
    iVar1 = aec_decode(strm,in_ESI);
    aec_decode_end(strm);
  }
  return iVar1;
}

Assistant:

int aec_buffer_decode(struct aec_stream *strm)
{
    int status = aec_decode_init(strm);
    if (status != AEC_OK)
        return status;

    status = aec_decode(strm, AEC_FLUSH);
    aec_decode_end(strm);
    return status;
}